

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utpm_sample.c
# Opt level: O3

int main(void)

{
  UINT16 UVar1;
  int iVar2;
  TPM_RC TVar3;
  UINT32 UVar4;
  char *__s;
  uchar *data_pos;
  TPM_SAMPLE_INFO tpm_info;
  uchar data_bytes [1024];
  uchar *local_728;
  TPM_SAMPLE_INFO local_720;
  uchar local_428 [1032];
  
  memset(&local_720,0,0x2f8);
  iVar2 = platform_init();
  if (iVar2 == 0) {
    TVar3 = TSS_CreatePwAuthSession(&NullAuth,&NullPwSession);
    __s = "Failure initializing TPM codec\r";
    if (TVar3 == 0) {
      TVar3 = Initialize_TPM_Codec(&local_720.tpm_device);
      if (TVar3 == 0) {
        GetEkTemplate_EkTemplate._8_4_ = ToTpmaObject(0x300b2);
        GetEkTemplate_EkTemplate._80_2_ = 6;
        GetEkTemplate_EkTemplate._82_2_ = (TPMU_SYM_KEY_BITS)0x80;
        GetEkTemplate_EkTemplate._84_2_ = (TPMU_SYM_MODE)0x43;
        GetEkTemplate_EkTemplate._86_2_ = 0x10;
        GetEkTemplate_EkTemplate._88_4_ = (TPMU_ASYM_SCHEME)0x0;
        GetEkTemplate_EkTemplate._92_2_ = 0x800;
        GetEkTemplate_EkTemplate._94_2_ = 0;
        GetEkTemplate_EkTemplate._96_4_ = 0;
        iVar2 = load_key(&local_720,0x81010001,0x4000000b,(TPM2B_PUBLIC *)GetEkTemplate_EkTemplate,
                         &local_720.ek_pub);
        __s = "Failure loading endorsement key\r";
        if (iVar2 == 0) {
          GetSrkTemplate_SrkTemplate._8_4_ = ToTpmaObject(0x30472);
          GetSrkTemplate_SrkTemplate._80_2_ = 6;
          GetSrkTemplate_SrkTemplate._82_2_ = (TPMU_SYM_KEY_BITS)0x80;
          GetSrkTemplate_SrkTemplate._84_2_ = (TPMU_SYM_MODE)0x43;
          GetSrkTemplate_SrkTemplate._86_2_ = 0x10;
          GetSrkTemplate_SrkTemplate._88_4_ = (TPMU_ASYM_SCHEME)0x0;
          GetSrkTemplate_SrkTemplate._92_2_ = 0x800;
          GetSrkTemplate_SrkTemplate._94_2_ = 0;
          GetSrkTemplate_SrkTemplate._96_4_ = 0;
          iVar2 = load_key(&local_720,0x81000001,0x40000001,
                           (TPM2B_PUBLIC *)GetSrkTemplate_SrkTemplate,&local_720.srk_pub);
          if (iVar2 == 0) {
            local_728 = local_428;
            UVar1 = TPM2B_PUBLIC_Marshal(&local_720.ek_pub,&local_728,(INT32 *)0x0);
            print_bytes("Endorsement Key: ",local_428,(ulong)UVar1);
            local_728 = local_428;
            UVar1 = TPM2B_PUBLIC_Marshal(&local_720.srk_pub,&local_728,(INT32 *)0x0);
            print_bytes("Storage Root Key: ",local_428,(ulong)UVar1);
            UVar4 = SignData(&local_720.tpm_device,&NullPwSession,(BYTE *)"Data to be signed by tpm"
                             ,0x18,local_428,0x400);
            if (UVar4 == 0) {
              puts("Failed to sign data with tpm\r");
            }
            else {
              print_bytes("Sign Data: ",local_428,(ulong)UVar4);
            }
            TSS_RandomBytes(local_428,0x20);
            print_bytes("Random bytes: ",local_428,0x20);
            Deinit_TPM_Codec(&local_720.tpm_device);
            iVar2 = 0;
            goto LAB_001039f3;
          }
        }
      }
    }
    puts(__s);
    iVar2 = 0xe0;
  }
  else {
    puts("platform_init failed\r");
    iVar2 = 0xcf;
  }
LAB_001039f3:
  platform_deinit();
  getchar();
  return iVar2;
}

Assistant:

int main(void)
{
    int result;

    TPM_SAMPLE_INFO tpm_info = { 0 };
    if (platform_init() != 0)
    {
        (void)printf("platform_init failed\r\n");
        result = __LINE__;
    }
    else if (initialize_tpm(&tpm_info) )
    {
        read_key_info(&tpm_info.ek_pub, "Endorsement Key: ");
        read_key_info(&tpm_info.srk_pub, "Storage Root Key: ");

        write_sign_data(&tpm_info, "Data to be signed by tpm");

        retrieve_random_bytes();

        Deinit_TPM_Codec(&tpm_info.tpm_device);

        result = 0;
    }
    else
    {
        result = __LINE__;
    }

    platform_deinit();

    (void)getchar();
    return result;
}